

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontProvider.cpp
# Opt level: O2

bool __thiscall
Rml::FontProvider::AddFace
          (FontProvider *this,FontFaceHandleFreetype face,String *family,FontStyle style,
          FontWeight weight,bool fallback_face,UniquePtr<byte[]> *face_memory)

{
  undefined8 __p;
  __uniq_ptr_impl<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_> *this_00;
  FontFace *pFVar1;
  __normal_iterator<Rml::FontFace_**,_std::vector<Rml::FontFace_*,_std::allocator<Rml::FontFace_*>_>_>
  _Var2;
  undefined7 in_register_00000009;
  undefined6 in_register_00000082;
  FontFamily *this_01;
  bool bVar3;
  iterator iVar4;
  FontFace *font_face_result;
  String family_lower;
  undefined1 local_88 [16];
  undefined1 local_78 [8];
  String local_70;
  String local_50;
  
  bVar3 = false;
  if (((int)CONCAT62(in_register_00000082,weight) != 0) &&
     (bVar3 = false, family->_M_string_length != 0)) {
    ::std::__cxx11::string::string((string *)&local_50,(string *)family);
    StringUtilities::ToLower((String *)(local_78 + 8),&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
    iVar4 = robin_hood::detail::
            Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&this->font_families,(key_type *)(local_78 + 8));
    local_88._12_4_ = (undefined4)CONCAT71(in_register_00000009,style);
    if (iVar4.mKeyVals == (NodePtr)(this->font_families).mInfo) {
      ::std::make_unique<Rml::FontFamily,std::__cxx11::string&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
      this_01 = (FontFamily *)local_88._0_8_;
      this_00 = (__uniq_ptr_impl<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_> *)
                robin_hood::detail::
                Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::FontFamily,std::default_delete<Rml::FontFamily>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                ::
                doCreateByKey<std::__cxx11::string_const&,std::unique_ptr<Rml::FontFamily,std::default_delete<Rml::FontFamily>>>
                          ((Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::FontFamily,std::default_delete<Rml::FontFamily>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                            *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(local_78 + 8));
      __p = local_88._0_8_;
      local_88._0_8_ = (FontFamily *)0x0;
      ::std::__uniq_ptr_impl<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_>::reset
                (this_00,(pointer)__p);
      ::std::unique_ptr<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_>::~unique_ptr
                ((unique_ptr<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_> *)local_88);
    }
    else {
      this_01 = ((iVar4.mKeyVals)->mData).second._M_t.
                super___uniq_ptr_impl<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_>._M_t.
                super__Tuple_impl<0UL,_Rml::FontFamily_*,_std::default_delete<Rml::FontFamily>_>.
                super__Head_base<0UL,_Rml::FontFamily_*,_false>._M_head_impl;
    }
    local_78 = (undefined1  [8])
               (face_memory->_M_t).
               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    (face_memory->_M_t).super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
    _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
    pFVar1 = FontFamily::AddFace(this_01,face,local_88[0xc],weight,(UniquePtr<byte[]> *)local_78);
    ::std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
              ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)local_78);
    local_88._0_8_ = pFVar1;
    if (fallback_face && pFVar1 != (FontFace *)0x0) {
      _Var2 = ::std::
              __find_if<__gnu_cxx::__normal_iterator<Rml::FontFace**,std::vector<Rml::FontFace*,std::allocator<Rml::FontFace*>>>,__gnu_cxx::__ops::_Iter_equals_val<Rml::FontFace*const>>
                        ((this->fallback_font_faces).
                         super__Vector_base<Rml::FontFace_*,_std::allocator<Rml::FontFace_*>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                         (this->fallback_font_faces).
                         super__Vector_base<Rml::FontFace_*,_std::allocator<Rml::FontFace_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish,local_88);
      if (_Var2._M_current ==
          (this->fallback_font_faces).
          super__Vector_base<Rml::FontFace_*,_std::allocator<Rml::FontFace_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        ::std::vector<Rml::FontFace_*,_std::allocator<Rml::FontFace_*>_>::push_back
                  (&this->fallback_font_faces,(value_type *)local_88);
      }
    }
    bVar3 = (FontFace *)local_88._0_8_ != (FontFace *)0x0;
    ::std::__cxx11::string::~string((string *)(local_78 + 8));
  }
  return bVar3;
}

Assistant:

bool FontProvider::AddFace(FontFaceHandleFreetype face, const String& family, Style::FontStyle style, Style::FontWeight weight, bool fallback_face,
	UniquePtr<byte[]> face_memory)
{
	if (family.empty() || weight == Style::FontWeight::Auto)
		return false;

	String family_lower = StringUtilities::ToLower(family);
	FontFamily* font_family = nullptr;
	auto it = font_families.find(family_lower);
	if (it != font_families.end())
	{
		font_family = (FontFamily*)it->second.get();
	}
	else
	{
		auto font_family_ptr = MakeUnique<FontFamily>(family_lower);
		font_family = font_family_ptr.get();
		font_families[family_lower] = std::move(font_family_ptr);
	}

	FontFace* font_face_result = font_family->AddFace(face, style, weight, std::move(face_memory));

	if (font_face_result && fallback_face)
	{
		auto it_fallback_face = std::find(fallback_font_faces.begin(), fallback_font_faces.end(), font_face_result);
		if (it_fallback_face == fallback_font_faces.end())
		{
			fallback_font_faces.push_back(font_face_result);
		}
	}

	return static_cast<bool>(font_face_result);
}